

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiwrapper.cxx
# Opt level: O2

int MPIABI_Type_get_contents
              (MPIABI_Datatype datatype,int max_integers,int max_addresses,int max_datatypes,
              int *array_of_integers,MPIABI_Aint *array_of_addresses,
              MPIABI_Datatype *array_of_datatypes)

{
  int iVar1;
  
  iVar1 = MPI_Type_get_contents();
  return iVar1;
}

Assistant:

int MPIABI_Type_get_contents(MPIABI_Datatype datatype,
                                        int max_integers, int max_addresses,
                                        int max_datatypes,
                                        int array_of_integers[],
                                        MPIABI_Aint array_of_addresses[],
                                        MPIABI_Datatype array_of_datatypes[]) {
  MPI_Datatype *const types = (MPI_Datatype *)(void *)array_of_datatypes;
  const int ierr = MPI_Type_get_contents(
      (WPI_Datatype)datatype, max_integers, max_addresses, max_datatypes,
      array_of_integers, (MPI_Aint *)array_of_addresses, types);
  if (sizeof(MPI_Datatype) != sizeof(MPIABI_Datatype))
    for (int i = max_datatypes - 1; i >= 0; --i)
      array_of_datatypes[i] = (WPI_Datatype)types[i];
  return ierr;
}